

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dac.c
# Opt level: O0

void * adc_new(t_symbol *s,int argc,t_atom *argv)

{
  t_gstub *ptVar1;
  t_float tVar2;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  t_atom defarg [2];
  t_adc *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  defarg[1].a_w.w_symbol = (t_symbol *)pd_new(adc_class);
  x = (t_adc *)argv;
  argv_local._4_4_ = argc;
  if (argc == 0) {
    x = (t_adc *)local_48;
    argv_local._4_4_ = 2;
    local_48 = (undefined1  [4])0x1;
    defarg[0].a_type = 0x3f800000;
    defarg[0].a_w.w_float = 1.4013e-45;
    defarg[1].a_type = 0x40000000;
  }
  ((defarg[1].a_w.w_array)->a_gp).gp_stub = (t_gstub *)(long)argv_local._4_4_;
  ptVar1 = (t_gstub *)getbytes((long)argv_local._4_4_ << 3);
  (defarg[1].a_w.w_array)->a_stub = ptVar1;
  for (local_4c = 0; local_4c < argv_local._4_4_; local_4c = local_4c + 1) {
    tVar2 = atom_getfloatarg(local_4c,argv_local._4_4_,(t_atom *)x);
    (&(defarg[1].a_w.w_array)->a_stub->gs_un)[local_4c] =
         (anon_union_8_2_d3a68b8d_for_gs_un)(long)tVar2;
  }
  for (local_4c = 0; local_4c < argv_local._4_4_; local_4c = local_4c + 1) {
    outlet_new((t_object *)defarg[1].a_w.w_symbol,&s_signal);
  }
  return defarg[1].a_w.w_symbol;
}

Assistant:

static void *adc_new(t_symbol *s, int argc, t_atom *argv)
{
    t_adc *x = (t_adc *)pd_new(adc_class);
    t_atom defarg[2];
    int i;
    if (!argc)
    {
        argv = defarg;
        argc = 2;
        SETFLOAT(&defarg[0], 1);
        SETFLOAT(&defarg[1], 2);
    }
    x->x_n = argc;
    x->x_vec = (t_int *)getbytes(argc * sizeof(*x->x_vec));
    for (i = 0; i < argc; i++)
        x->x_vec[i] = atom_getfloatarg(i, argc, argv);
    for (i = 0; i < argc; i++)
        outlet_new(&x->x_obj, &s_signal);
    return (x);
}